

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbsvolume.cpp
# Opt level: O1

bool __thiscall
ON_MorphControl::AddConvexPolygonLocalizer
          (ON_MorphControl *this,ON_SimpleArray<ON_Plane> *planes,double support_distance,
          double falloff_distance)

{
  uint uVar1;
  ON_Plane *pOVar2;
  ON_3dPoint P;
  ON_3dVector N;
  byte bVar3;
  ON_Localizer *this_00;
  size_t new_capacity;
  ulong uVar4;
  long lVar5;
  
  bVar3 = -(0.0 <= support_distance) & -(0.0 < falloff_distance);
  if ((bVar3 & 1) != 0) {
    uVar1 = planes->m_count;
    new_capacity = (long)(int)uVar1 + (long)(this->m_localizers).m_count;
    if ((uint)(this->m_localizers).m_capacity < (uint)new_capacity) {
      ON_ClassArray<ON_Localizer>::SetCapacity(&this->m_localizers,new_capacity);
    }
    if ((~bVar3 & 1) == 0 && 0 < (int)uVar1) {
      uVar4 = 1;
      lVar5 = 0;
      do {
        pOVar2 = planes->m_a;
        this_00 = ON_ClassArray<ON_Localizer>::AppendNew(&this->m_localizers);
        P.z = *(double *)((long)&(pOVar2->origin).z + lVar5);
        P._0_16_ = *(undefined1 (*) [16])((long)&(pOVar2->origin).x + lVar5);
        N.z = *(double *)((long)&(pOVar2->zaxis).z + lVar5);
        N._0_16_ = *(undefined1 (*) [16])((long)&(pOVar2->zaxis).x + lVar5);
        bVar3 = ON_Localizer::CreatePlaneLocalizer
                          (this_00,P,N,falloff_distance + support_distance,support_distance);
        if (uVar1 <= uVar4) break;
        lVar5 = lVar5 + 0x80;
        uVar4 = uVar4 + 1;
      } while ((bool)bVar3);
    }
  }
  return (bool)(bVar3 & 1);
}

Assistant:

bool ON_MorphControl::AddConvexPolygonLocalizer(
  const ON_SimpleArray<ON_Plane>& planes,
  double support_distance, 
  double falloff_distance
  )
{
  int i, count = planes.Count();
  bool rc = (support_distance >= 0.0 && falloff_distance > 0.0 );
  if (rc)
  {
    m_localizers.Reserve(m_localizers.Count() + count);
    for( i = 0; i < count && rc; i++)
    {
      const ON_Plane& plane = planes[i];
      ON_Localizer& localizer = m_localizers.AppendNew();
      rc = localizer.CreatePlaneLocalizer(
                    plane.origin,plane.zaxis,
                    support_distance+falloff_distance,
                    support_distance);
    }
  }
  return rc;
}